

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

TestBuilder * __thiscall
anon_unknown.dwarf_f383c3::TestBuilder::EditPush
          (TestBuilder *this,uint pos,string *hexin,string *hexout)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  long lVar1;
  ulong uVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  const_iterator __first_00;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  string_view hex_str;
  string_view hex_str_00;
  const_string file;
  lazy_ostream local_e0;
  undefined1 *local_d0;
  string *local_c8;
  allocator_type local_b9;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  assertion_result local_a0;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dataout;
  vector<unsigned_char,_std::allocator<unsigned_char>_> datain;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->havePush == false) {
    __assert_fail("havePush",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
                  ,0x164,
                  "TestBuilder &(anonymous namespace)::TestBuilder::EditPush(unsigned int, const std::string &, const std::string &)"
                 );
  }
  uVar2 = (ulong)pos;
  hex_str._M_str = (hexin->_M_dataplus)._M_p;
  hex_str._M_len = hexin->_M_string_length;
  ParseHex<unsigned_char>(&datain,hex_str);
  hex_str_00._M_str = (hexout->_M_dataplus)._M_p;
  hex_str_00._M_len = hexout->_M_string_length;
  ParseHex<unsigned_char>(&dataout,hex_str_00);
  if (datain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish +
      (uVar2 - (long)datain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) <=
      (this->push).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish +
      -(long)(this->push).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start) {
    local_78 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_70 = "";
    local_88 = &boost::unit_test::basic_cstring<char_const>::null;
    local_80 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x168;
    file.m_begin = (iterator)&local_78;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_88,msg);
    this_00 = &this->push;
    __first._M_current =
         (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start + uVar2;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b8,__first,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(__first._M_current +
                 ((long)datain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)datain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start)),&local_b9);
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8,&datain)
    ;
    local_a0.m_message.px = (element_type *)0x0;
    local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_c8 = &this->comment;
    local_e0.m_empty = false;
    local_e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139e30;
    local_d0 = boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion
              (&local_a0,&local_e0,1,1,WARN,0xbcb770,(size_t)&stack0xffffffffffffff10,0x168);
    boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b8);
    __first_00._M_current =
         (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start + uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
              (this_00,__first_00,
               (const_iterator)
               (__first_00._M_current +
               ((long)datain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)datain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start)));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,
               (const_iterator)
               ((this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start + uVar2),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )dataout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )dataout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&dataout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&datain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return this;
    }
    __stack_chk_fail();
  }
  __assert_fail("pos + datain.size() <= push.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
                ,0x167,
                "TestBuilder &(anonymous namespace)::TestBuilder::EditPush(unsigned int, const std::string &, const std::string &)"
               );
}

Assistant:

TestBuilder& EditPush(unsigned int pos, const std::string& hexin, const std::string& hexout)
    {
        assert(havePush);
        std::vector<unsigned char> datain = ParseHex(hexin);
        std::vector<unsigned char> dataout = ParseHex(hexout);
        assert(pos + datain.size() <= push.size());
        BOOST_CHECK_MESSAGE(std::vector<unsigned char>(push.begin() + pos, push.begin() + pos + datain.size()) == datain, comment);
        push.erase(push.begin() + pos, push.begin() + pos + datain.size());
        push.insert(push.begin() + pos, dataout.begin(), dataout.end());
        return *this;
    }